

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::uniformMatrix4fv
          (ReferenceContext *this,deInt32 location,deInt32 count,deBool transpose,float *value)

{
  float fVar1;
  deBool dVar2;
  vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_> *this_00;
  size_type sVar3;
  reference pvVar4;
  int local_40;
  int local_3c;
  int col_1;
  int row_1;
  int col;
  int row;
  vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_> *uniforms;
  float *value_local;
  deBool transpose_local;
  deInt32 count_local;
  deInt32 location_local;
  ReferenceContext *this_local;
  
  do {
    if (this->m_currentProgram == (ShaderProgramObjectContainer *)0x0) {
      setError(this,0x502);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  this_00 = &this->m_currentProgram->m_program->m_uniforms;
  if (location != -1) {
    do {
      if ((location < 0) ||
         (sVar3 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::size(this_00),
         sVar3 <= (ulong)(long)location)) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (count != 0) {
      do {
        if ((transpose != 1) && (transpose != 0)) {
          setError(this,0x500);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pvVar4 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                         (this_00,(long)location);
      if (pvVar4->type == TYPE_FLOAT_MAT4) {
        do {
          if (1 < count) {
            setError(this,0x502);
            return;
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        if (transpose == 0) {
          for (row_1 = 0; row_1 < 4; row_1 = row_1 + 1) {
            for (col_1 = 0; col_1 < 4; col_1 = col_1 + 1) {
              fVar1 = value[col_1 * 3 + row_1];
              pvVar4 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::
                       operator[](this_00,(long)location);
              *(float *)((long)&pvVar4->value + (long)(row_1 * 3 + col_1) * 4) = fVar1;
            }
          }
        }
        else {
          for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
            for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
              fVar1 = value[local_3c * 3 + local_40];
              pvVar4 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::
                       operator[](this_00,(long)location);
              *(float *)((long)&pvVar4->value + (long)(local_3c * 3 + local_40) * 4) = fVar1;
            }
          }
        }
      }
      else {
        setError(this,0x502);
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::uniformMatrix4fv (deInt32 location, deInt32 count, deBool transpose, const float *value)
{
	RC_IF_ERROR(m_currentProgram == DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);

	std::vector<sglr::UniformSlot>& uniforms = m_currentProgram->m_program->m_uniforms;

	if (location == -1)
		return;

	RC_IF_ERROR(location < 0 || (size_t)location >= uniforms.size(), GL_INVALID_OPERATION, RC_RET_VOID);

	if (count == 0)
		return;

	RC_IF_ERROR(transpose != GL_TRUE && transpose != GL_FALSE, GL_INVALID_ENUM, RC_RET_VOID);

	switch (uniforms[location].type)
	{
		case glu::TYPE_FLOAT_MAT4:
			RC_IF_ERROR(count > 1, GL_INVALID_OPERATION, RC_RET_VOID);

			if (transpose == GL_FALSE) // input is column major => transpose from column major to internal row major
				for (int row = 0; row < 4; ++row)
				for (int col = 0; col < 4; ++col)
					uniforms[location].value.m4[row*3+col] = value[col*3+row];
			else // input is row major
				for (int row = 0; row < 4; ++row)
				for (int col = 0; col < 4; ++col)
					uniforms[location].value.m4[row*3+col] = value[row*3+col];

			break;

		default:
			setError(GL_INVALID_OPERATION);
			return;
	}
}